

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ResizeActuallyResizes_Test<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ResizeActuallyResizes_Test<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  AssertHelper *this_00;
  unsigned_long *val1;
  AssertHelper *this_01;
  long in_RDI;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  int i_3;
  AssertionResult gtest_ar_3;
  int i_2;
  AssertionResult gtest_ar_2;
  TypeParam ht2;
  AssertionResult gtest_ar_1;
  int i_1;
  int pre_copies;
  AssertionResult gtest_ar;
  int i;
  int kThreshold;
  float kResize;
  size_type kSize;
  float in_stack_fffffffffffffb78;
  float in_stack_fffffffffffffb7c;
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb80;
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb88;
  hasher *in_stack_fffffffffffffb90;
  char *in_stack_fffffffffffffb98;
  int line;
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffba0;
  char *in_stack_fffffffffffffba8;
  Type type;
  AssertHelper *in_stack_fffffffffffffbb0;
  Message *in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc04;
  AssertionResult local_3a8 [6];
  value_type *in_stack_fffffffffffffcb8;
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffcc0;
  AssertionResult local_318;
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *local_308;
  int local_2fc;
  AssertHelper *local_2e8;
  AssertionResult local_2e0 [7];
  int local_264;
  size_type local_250;
  AssertionResult local_248;
  key_type local_238;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_230;
  Hasher local_220;
  Hasher local_214 [15];
  int local_158;
  int local_154;
  AssertionResult local_150 [7];
  key_type local_d8;
  int local_d0;
  int local_cc;
  size_type local_b8;
  AssertionResult local_b0 [8];
  int local_24;
  key_type local_20;
  undefined4 local_18;
  undefined4 local_14;
  undefined8 local_10;
  
  local_10 = 0x400;
  local_14 = 0x3f4ccccd;
  local_18 = 0x332;
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_resizing_parameters
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78);
  local_20 = HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffba0,(int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffffb80,
                    (key_type *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  for (local_24 = 0; local_24 < 0x333; local_24 = local_24 + 1) {
    HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject(in_stack_fffffffffffffb88,(int)((ulong)in_stack_fffffffffffffb80 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0x102c2c6);
  }
  local_b8 = google::
             BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0x102c313);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb98,(char *)in_stack_fffffffffffffb90,
             (unsigned_long *)in_stack_fffffffffffffb88,(unsigned_long *)in_stack_fffffffffffffb80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbb0);
    testing::AssertionResult::failure_message((AssertionResult *)0x102c37a);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffbb0,(Type)((ulong)in_stack_fffffffffffffba8 >> 0x20),
               (char *)in_stack_fffffffffffffba0,(int)((ulong)in_stack_fffffffffffffb98 >> 0x20),
               (char *)in_stack_fffffffffffffb90);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
               in_stack_fffffffffffffbf8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb80);
    testing::Message::~Message((Message *)0x102c3dd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x102c44e);
  local_cc = google::
             HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
             ::num_table_copies((HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                                 *)(in_RDI + 0x10));
  for (local_d0 = 0; local_d0 < 0x400; local_d0 = local_d0 + 1) {
    in_stack_fffffffffffffc04 = 0x332;
    local_d8 = HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffba0,(int)((ulong)in_stack_fffffffffffffb98 >> 0x20)
                          );
    google::
    BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffffb80,
            (key_type *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject(in_stack_fffffffffffffb88,(int)((ulong)in_stack_fffffffffffffb80 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0x102c517);
  }
  local_154 = google::
              HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::num_table_copies((HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                                  *)(in_RDI + 0x10));
  local_158 = local_cc + 2;
  testing::internal::CmpHelperLT<int,int>
            (in_stack_fffffffffffffb98,(char *)in_stack_fffffffffffffb90,
             (int *)in_stack_fffffffffffffb88,(int *)in_stack_fffffffffffffb80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_150);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbb0);
    in_stack_fffffffffffffbf8 =
         (Message *)testing::AssertionResult::failure_message((AssertionResult *)0x102c5ed);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffbb0,(Type)((ulong)in_stack_fffffffffffffba8 >> 0x20),
               (char *)in_stack_fffffffffffffba0,(int)((ulong)in_stack_fffffffffffffb98 >> 0x20),
               (char *)in_stack_fffffffffffffb90);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
               in_stack_fffffffffffffbf8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb80);
    testing::Message::~Message((Message *)0x102c650);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x102c6c1);
  Hasher::Hasher(local_214,0);
  Hasher::Hasher(&local_220,0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(&local_230,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)in_stack_fffffffffffffba0,(size_type)in_stack_fffffffffffffb98,
             in_stack_fffffffffffffb90,(key_equal *)in_stack_fffffffffffffb88,
             (allocator_type *)in_stack_fffffffffffffb80);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_230);
  local_238 = HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffffba0,(int)((ulong)in_stack_fffffffffffffb98 >> 0x20))
  ;
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffffb80,
                    (key_type *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_resizing_parameters
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78);
  local_250 = google::
              BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0x102c7a0);
  testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
            (in_stack_fffffffffffffb98,(char *)in_stack_fffffffffffffb90,
             (unsigned_long *)in_stack_fffffffffffffb88,(unsigned_long *)in_stack_fffffffffffffb80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_248);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbb0);
    testing::AssertionResult::failure_message((AssertionResult *)0x102c866);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffbb0,(Type)((ulong)in_stack_fffffffffffffba8 >> 0x20),
               (char *)in_stack_fffffffffffffba0,(int)((ulong)in_stack_fffffffffffffb98 >> 0x20),
               (char *)in_stack_fffffffffffffb90);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
               in_stack_fffffffffffffbf8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb80);
    testing::Message::~Message((Message *)0x102c8c3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x102c934);
  for (local_264 = 0; local_264 < 0x333; local_264 = local_264 + 1) {
    HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject(in_stack_fffffffffffffb88,(int)((ulong)in_stack_fffffffffffffb80 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0x102c99c);
  }
  this_00 = (AssertHelper *)
            google::
            BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)0x102c9f4);
  local_2e8 = this_00;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb98,(char *)in_stack_fffffffffffffb90,
             (unsigned_long *)in_stack_fffffffffffffb88,(unsigned_long *)in_stack_fffffffffffffb80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2e0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffba8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x102ca69);
    testing::internal::AssertHelper::AssertHelper
              (this_00,(Type)((ulong)in_stack_fffffffffffffba8 >> 0x20),
               (char *)in_stack_fffffffffffffba0,(int)((ulong)in_stack_fffffffffffffb98 >> 0x20),
               (char *)in_stack_fffffffffffffb90);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
               in_stack_fffffffffffffbf8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb80);
    testing::Message::~Message((Message *)0x102cac6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x102cb37);
  for (local_2fc = 0; type = (Type)((ulong)in_stack_fffffffffffffba8 >> 0x20), local_2fc < 0x333;
      local_2fc = local_2fc + 1) {
    in_stack_fffffffffffffba0 =
         (HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          *)HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffffba0,(int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
    local_308 = in_stack_fffffffffffffba0;
    google::
    BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffffb80,
            (key_type *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    in_stack_fffffffffffffb98 =
         (char *)google::
                 BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                 ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                                 *)0x102cba1);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              (in_stack_fffffffffffffb98,(char *)in_stack_fffffffffffffb90,
               (unsigned_long *)in_stack_fffffffffffffb88,(unsigned_long *)in_stack_fffffffffffffb80
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_318);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      in_stack_fffffffffffffb90 =
           (hasher *)testing::AssertionResult::failure_message((AssertionResult *)0x102cc28);
      testing::internal::AssertHelper::AssertHelper
                (this_00,(Type)((ulong)in_stack_fffffffffffffba8 >> 0x20),
                 (char *)in_stack_fffffffffffffba0,(int)((ulong)in_stack_fffffffffffffb98 >> 0x20),
                 (char *)in_stack_fffffffffffffb90);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 in_stack_fffffffffffffbf8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb80);
      testing::Message::~Message((Message *)0x102cc85);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x102ccf0);
  }
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_fffffffffffffb88,(int)((ulong)in_stack_fffffffffffffb80 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0x102cd60);
  val1 = (unsigned_long *)
         google::
         BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                         *)0x102cd6d);
  testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
            (in_stack_fffffffffffffb98,(char *)in_stack_fffffffffffffb90,val1,
             (unsigned_long *)in_stack_fffffffffffffb80);
  line = (int)((ulong)in_stack_fffffffffffffb98 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3a8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    this_01 = (AssertHelper *)
              testing::AssertionResult::failure_message((AssertionResult *)0x102ce08);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)in_stack_fffffffffffffba0,line,(char *)in_stack_fffffffffffffb90
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
               in_stack_fffffffffffffbf8);
    testing::internal::AssertHelper::~AssertHelper(this_01);
    testing::Message::~Message((Message *)0x102ce65);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x102ced0);
  google::
  HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0x102cedd);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ResizeActuallyResizes) {
  // This tests for a problem we had where we could repeatedly "resize"
  // a hashtable to the same size it was before, on every insert.
  const typename TypeParam::size_type kSize = 1 << 10;  // Pick any power of 2
  const float kResize = 0.8f;  // anything between 0.5 and 1 is fine.
  const int kThreshold = static_cast<int>(kSize * kResize - 1);
  this->ht_.set_resizing_parameters(0, kResize);
  this->ht_.set_deleted_key(this->UniqueKey(kThreshold + 100));

  // Get right up to the resizing threshold.
  for (int i = 0; i <= kThreshold; i++) {
    this->ht_.insert(this->UniqueObject(i + 1));
  }
  // The bucket count should equal kSize.
  EXPECT_EQ(kSize, this->ht_.bucket_count());

  // Now start doing erase+insert pairs.  This should cause us to
  // copy the hashtable at most once.
  const int pre_copies = this->ht_.num_table_copies();
  for (int i = 0; i < static_cast<int>(kSize); i++) {
    this->ht_.erase(this->UniqueKey(kThreshold));
    this->ht_.insert(this->UniqueObject(kThreshold));
  }
  EXPECT_LT(this->ht_.num_table_copies(), pre_copies + 2);

  // Now create a hashtable where we go right to the threshold, then
  // delete everything and do one insert.  Even though our hashtable
  // is now tiny, we should still have at least kSize buckets, because
  // our shrink threshhold is 0.
  TypeParam ht2;
  ht2.set_deleted_key(this->UniqueKey(kThreshold + 100));
  ht2.set_resizing_parameters(0, kResize);
  EXPECT_LT(ht2.bucket_count(), kSize);
  for (int i = 0; i <= kThreshold; i++) {
    ht2.insert(this->UniqueObject(i + 1));
  }
  EXPECT_EQ(ht2.bucket_count(), kSize);
  for (int i = 0; i <= kThreshold; i++) {
    ht2.erase(this->UniqueKey(i + 1));
    EXPECT_EQ(ht2.bucket_count(), kSize);
  }
  ht2.insert(this->UniqueObject(kThreshold + 2));
  EXPECT_GE(ht2.bucket_count(), kSize);
}